

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariableTests.cpp
# Opt level: O1

void __thiscall
triggervariable_waitTrigger_Test::~triggervariable_waitTrigger_Test
          (triggervariable_waitTrigger_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(triggervariable, waitTrigger)
{
    TriggerVariable trigger;
    trigger.activate();
    std::atomic<bool> started{false};
    std::atomic<bool> completed{false};
    auto fut = std::async(std::launch::async, [&]() {
        started = true;
        trigger.wait();
        completed = true;
    });

    std::this_thread::yield();
    while (!started.load()) {
        std::this_thread::yield();
    }
    EXPECT_TRUE(started.load());

    EXPECT_FALSE(completed.load());
    trigger.trigger();
    std::this_thread::yield();
    if (!completed.load()) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }
    EXPECT_TRUE(completed.load());
}